

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int getDigits(char *zDate,char *zFormat,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  byte *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  long in_FS_OFFSET;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  u16 max;
  int val;
  char min;
  char N;
  char nextC;
  int cnt;
  va_list ap;
  undefined8 *local_118;
  undefined8 local_f8 [4];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  ushort local_46;
  int local_44;
  char local_3f;
  char local_3e;
  byte local_3d;
  int local_3c;
  char *local_38;
  byte *local_30;
  undefined8 local_28;
  undefined8 *local_20;
  undefined8 *local_18;
  long local_8;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0;
  local_18 = local_f8;
  local_20 = (undefined8 *)&stack0x00000008;
  local_28 = 0x3000000010;
  local_38 = in_RSI;
  local_30 = in_RDI;
  do {
    local_3f = local_38[1] + -0x30;
    local_46 = getDigits::aMx[local_38[2] + -0x61];
    local_3d = local_38[3];
    local_44 = 0;
    local_3e = *local_38 + -0x30;
    while (local_3e != '\0') {
      if ((""[*local_30] & 4) == 0) goto LAB_0022eb3a;
      local_44 = local_44 * 10 + (int)(char)*local_30 + -0x30;
      local_30 = local_30 + 1;
      local_3e = local_3e + -1;
    }
    if (((local_44 < local_3f) || ((int)(uint)local_46 < local_44)) ||
       ((local_3d != 0 && (local_3d != *local_30)))) break;
    if ((uint)local_28 < 0x29) {
      local_118 = (undefined8 *)((long)local_18 + (long)(int)(uint)local_28);
      local_28._0_4_ = (uint)local_28 + 8;
    }
    else {
      local_118 = local_20;
      local_20 = local_20 + 1;
    }
    *(int *)*local_118 = local_44;
    local_30 = local_30 + 1;
    local_3c = local_3c + 1;
    local_38 = local_38 + 4;
  } while (local_3d != 0);
LAB_0022eb3a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    local_f8[2] = in_RDX;
    local_f8[3] = in_RCX;
    local_d8 = in_R8;
    local_d0 = in_R9;
    local_3e = local_3e + -1;
    __stack_chk_fail();
  }
  return local_3c;
}

Assistant:

static int getDigits(const char *zDate, const char *zFormat, ...){
  /* The aMx[] array translates the 3rd character of each format
  ** spec into a max size:    a   b   c   d   e      f */
  static const u16 aMx[] = { 12, 14, 24, 31, 59, 14712 };
  va_list ap;
  int cnt = 0;
  char nextC;
  va_start(ap, zFormat);
  do{
    char N = zFormat[0] - '0';
    char min = zFormat[1] - '0';
    int val = 0;
    u16 max;

    assert( zFormat[2]>='a' && zFormat[2]<='f' );
    max = aMx[zFormat[2] - 'a'];
    nextC = zFormat[3];
    val = 0;
    while( N-- ){
      if( !sqlite3Isdigit(*zDate) ){
        goto end_getDigits;
      }
      val = val*10 + *zDate - '0';
      zDate++;
    }
    if( val<(int)min || val>(int)max || (nextC!=0 && nextC!=*zDate) ){
      goto end_getDigits;
    }
    *va_arg(ap,int*) = val;
    zDate++;
    cnt++;
    zFormat += 4;
  }while( nextC );
end_getDigits:
  va_end(ap);
  return cnt;
}